

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O3

vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
indk::NeuralNet::doSignalReceive
          (vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,NeuralNet *this,string *ensemble)

{
  pointer pcVar1;
  size_t __n;
  long *__s1;
  pointer pbVar2;
  int iVar3;
  iterator iVar4;
  iterator iVar5;
  ulong uVar6;
  long lVar7;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pvVar8;
  pointer pbVar9;
  pointer pbVar10;
  pointer pbVar11;
  _Base_ptr p_Var12;
  pointer __k;
  pair<long,_float> pVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  elist;
  long *local_118;
  float local_110;
  undefined4 uStack_10c;
  long local_108 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  long *local_98;
  long local_90;
  long local_88 [2];
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_60;
  pointer local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
  *local_40;
  pointer local_38;
  
  local_78.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((ensemble->_M_string_length == 0) ||
     ((iVar4 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::find(&(this->Ensembles)._M_t,ensemble), pvVar8 = __return_storage_ptr__,
      (_Rb_tree_header *)iVar4._M_node != &(this->Ensembles)._M_t._M_impl.super__Rb_tree_header &&
      (std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::operator=(&local_f8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(iVar4._M_node + 2)),
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)))) {
    __k = (this->Outputs).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    local_38 = (this->Outputs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_60 = __return_storage_ptr__;
    if (__k != local_38) {
      local_40 = &this->Neurons;
      p_Var12 = &(this->Neurons)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_50 = p_Var12;
      do {
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
                ::find(&local_40->_M_t,__k);
        pbVar2 = local_f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar10 = local_f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (iVar5._M_node != p_Var12) {
          if (local_f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pcVar1 = (__k->_M_dataplus)._M_p;
            local_d8 = local_c8;
            local_48 = iVar5._M_node;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d8,pcVar1,pcVar1 + __k->_M_string_length);
            local_b8 = local_a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b8,local_d8,local_d0 + (long)local_d8);
            local_118 = local_108;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_118,local_b8,local_b0 + (long)local_b8);
            local_98 = local_88;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_98,local_118,
                       CONCAT44(uStack_10c,local_110) + (long)local_118);
            if (local_118 != local_108) {
              operator_delete(local_118,local_108[0] + 1);
            }
            local_118 = local_108;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_118,local_98,local_90 + (long)local_98);
            __s1 = local_118;
            __n = CONCAT44(uStack_10c,local_110);
            uVar6 = (long)pbVar2 - (long)pbVar10;
            if (0 < (long)uVar6 >> 7) {
              local_58 = (pointer)((long)&(pbVar10->_M_dataplus)._M_p + (uVar6 & 0xffffffffffffff80)
                                  );
              lVar7 = ((long)uVar6 >> 7) + 1;
              pbVar11 = pbVar10 + 2;
              do {
                if (pbVar11[-2]._M_string_length == __n) {
                  if (__n == 0) {
                    pbVar9 = pbVar11 + -2;
                    goto LAB_00166f00;
                  }
                  iVar3 = bcmp(__s1,pbVar11[-2]._M_dataplus._M_p,__n);
                  pbVar9 = pbVar10;
                  if (iVar3 == 0) goto LAB_00166f00;
                  if (pbVar11[-1]._M_string_length == __n) {
                    pbVar9 = pbVar11 + -1;
                    goto LAB_00166dc2;
                  }
                }
                else if (pbVar11[-1]._M_string_length == __n) {
                  if (__n == 0) {
                    pbVar9 = pbVar11 + -1;
                    goto LAB_00166f00;
                  }
                  pbVar9 = pbVar10 + 1;
LAB_00166dc2:
                  iVar3 = bcmp(__s1,(pbVar9->_M_dataplus)._M_p,__n);
                  if (iVar3 == 0) goto LAB_00166f00;
                }
                if (pbVar11->_M_string_length == __n) {
                  pbVar9 = pbVar11;
                  if ((__n == 0) || (iVar3 = bcmp(__s1,(pbVar11->_M_dataplus)._M_p,__n), iVar3 == 0)
                     ) goto LAB_00166f00;
                  if (pbVar11[1]._M_string_length == __n) {
                    pbVar9 = pbVar11 + 1;
                    goto LAB_00166e20;
                  }
                }
                else if (pbVar11[1]._M_string_length == __n) {
                  if (__n == 0) {
                    pbVar9 = pbVar11 + 1;
                    goto LAB_00166f00;
                  }
                  pbVar9 = pbVar10 + 3;
LAB_00166e20:
                  iVar3 = bcmp(__s1,(pbVar9->_M_dataplus)._M_p,__n);
                  if (iVar3 == 0) goto LAB_00166f00;
                }
                pbVar10 = pbVar10 + 4;
                lVar7 = lVar7 + -1;
                pbVar11 = pbVar11 + 4;
              } while (1 < lVar7);
              uVar6 = (long)pbVar2 - (long)local_58;
              pbVar10 = local_58;
            }
            lVar7 = (long)uVar6 >> 5;
            if (lVar7 == 1) {
LAB_00166ec3:
              if ((pbVar10->_M_string_length != __n) ||
                 ((pbVar9 = pbVar10, __n != 0 &&
                  (iVar3 = bcmp(__s1,(pbVar10->_M_dataplus)._M_p,__n), iVar3 != 0)))) {
LAB_00166ee1:
                pbVar9 = pbVar2;
              }
            }
            else if (lVar7 == 2) {
LAB_00166ea1:
              if ((pbVar10->_M_string_length != __n) ||
                 ((pbVar9 = pbVar10, __n != 0 &&
                  (iVar3 = bcmp(__s1,(pbVar10->_M_dataplus)._M_p,__n), iVar3 != 0)))) {
                pbVar10 = pbVar10 + 1;
                goto LAB_00166ec3;
              }
            }
            else {
              if (lVar7 != 3) goto LAB_00166ee1;
              if ((pbVar10->_M_string_length != __n) ||
                 ((pbVar9 = pbVar10, __n != 0 &&
                  (iVar3 = bcmp(__s1,(pbVar10->_M_dataplus)._M_p,__n), iVar3 != 0)))) {
                pbVar10 = pbVar10 + 1;
                goto LAB_00166ea1;
              }
            }
LAB_00166f00:
            if (__s1 != local_108) {
              operator_delete(__s1,local_108[0] + 1);
            }
            p_Var12 = local_50;
            if (local_98 != local_88) {
              operator_delete(local_98,local_88[0] + 1);
            }
            if (local_b8 != local_a8) {
              operator_delete(local_b8,local_a8[0] + 1);
            }
            if (local_d8 != local_c8) {
              operator_delete(local_d8,local_c8[0] + 1);
            }
            iVar5._M_node = local_48;
            if (pbVar9 == local_f8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00166fc5;
          }
          pVar13 = Neuron::doSignalReceive(*(Neuron **)(iVar5._M_node + 2),-1);
          local_110 = pVar13.second;
          local_118 = (long *)pVar13.first;
          std::
          vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>
          ::emplace_back<float,std::__cxx11::string_const&>
                    ((vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>
                      *)&local_78,&local_110,__k);
        }
LAB_00166fc5:
        __k = __k + 1;
      } while (__k != local_38);
    }
    __return_storage_ptr__ = &local_78;
    (local_60->
    super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_78.
         super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (local_60->
    super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_78.
         super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (local_60->
    super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_78.
         super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar8 = local_60;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_78);
  return pvVar8;
}

Assistant:

std::vector<indk::OutputValue> indk::NeuralNet::doSignalReceive(const std::string& ensemble) {
    std::vector<indk::OutputValue> ny;
    std::vector<std::string> elist;

    if (!ensemble.empty()) {
        auto en = Ensembles.find(ensemble);
        if (en == Ensembles.end()) return {};
        elist = en -> second;
        if (elist.empty()) return {};
    }

    for (const auto& oname: Outputs) {
        auto n = Neurons.find(oname);
        if (n != Neurons.end()) {
            if (!elist.empty()) {
                auto item = std::find_if(elist.begin(), elist.end(), [oname](const std::string &value) {
                    return oname == value;
                });
                if (item == elist.end()) continue;
            }

            ny.emplace_back(n->second->doSignalReceive().second, oname);
        }
    }
    return ny;
}